

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcIShapeProfileDef::IfcIShapeProfileDef
          (IfcIShapeProfileDef *this,void **vtt)

{
  void **vtt_local;
  IfcIShapeProfileDef *this_local;
  
  IfcParameterizedProfileDef::IfcParameterizedProfileDef
            (&this->super_IfcParameterizedProfileDef,vtt + 1);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcIShapeProfileDef,_5UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcIShapeProfileDef,_5UL> *)
             &(this->super_IfcParameterizedProfileDef).field_0x70,vtt + 10);
  (this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper =
       (_func_int **)*vtt;
  *(void **)((long)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
                    _vptr_ObjectHelper +
            (long)(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.
                  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper
                  [-3]) = vtt[0xc];
  *(void **)&(this->super_IfcParameterizedProfileDef).super_IfcProfileDef.field_0x58 = vtt[0xd];
  *(void **)&(this->super_IfcParameterizedProfileDef).field_0x70 = vtt[0xe];
  STEP::Maybe<double>::Maybe(&this->FilletRadius);
  return;
}

Assistant:

IfcIShapeProfileDef() : Object("IfcIShapeProfileDef") {}